

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_bst.h
# Opt level: O0

int * __thiscall
CP::map_bst<int,_int,_std::less<int>_>::operator[]
          (map_bst<int,_int,_std::less<int>_> *this,int *key)

{
  node *this_00;
  node **ppnVar1;
  int local_34;
  pair<int,_int> local_30;
  node *local_28;
  node *ptr;
  node *parent;
  int *key_local;
  map_bst<int,_int,_std::less<int>_> *this_local;
  
  ptr = (node *)0x0;
  parent = (node *)key;
  key_local = (int *)this;
  local_28 = find_node(this,key,this->mRoot,&ptr);
  if (local_28 == (node *)0x0) {
    this_00 = (node *)operator_new(0x20);
    local_34 = 0;
    local_30 = std::make_pair<int_const&,int>((int *)parent,&local_34);
    node::node(this_00,&local_30,(node *)0x0,(node *)0x0,ptr);
    local_28 = this_00;
    ppnVar1 = child_link(this,ptr,(int *)parent);
    *ppnVar1 = this_00;
    this->mSize = this->mSize + 1;
  }
  return &(local_28->data).second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      node *parent = NULL;
      node *ptr = find_node(key, mRoot, parent);
      if (ptr == NULL) {
        ptr = new node(std::make_pair(key,MappedT()),NULL,NULL,parent);
        child_link(parent, key) = ptr;
        mSize++;
      }
      return ptr->data.second;
    }